

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

void __thiscall Reader::processobjsec(Reader *this)

{
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  iterator iVar2;
  Expression *pEVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  invalid_argument *this_02;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  key_type local_5c;
  Expression *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  shared_ptr<Expression> local_40;
  shared_ptr<Expression> local_30;
  
  local_58 = (Expression *)operator_new(0x58);
  (local_58->linterms).
  super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_58->linterms).
  super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_58->linterms).
  super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_58->quadterms).
  super__Vector_base<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (local_58->quadterms).
  super__Vector_base<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_58->quadterms).
  super__Vector_base<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58->offset = 0.0;
  (local_58->name)._M_dataplus._M_p = (pointer)&(local_58->name).field_2;
  (local_58->name)._M_string_length = 0;
  (local_58->name).field_2._M_local_buf[0] = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Expression*>(a_Stack_50,local_58);
  _Var4._M_pi = a_Stack_50[0]._M_pi;
  pEVar3 = local_58;
  local_58 = (Expression *)0x0;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (this->builder).model.objective.
            super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->builder).model.objective.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = pEVar3;
  (this->builder).model.objective.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  if ((this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01),
     a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
  }
  p_Var7 = (this->sectiontokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 != (_Base_ptr)0x0) {
    this_00 = &this->sectiontokens;
    p_Var1 = &(this->sectiontokens)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    p_Var9 = p_Var7;
    do {
      if (0 < (int)p_Var9[1]._M_color) {
        p_Var8 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < 1];
    } while (p_Var9 != (_Base_ptr)0x0);
    p_Var9 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var8 == p_Var1) || (1 < (int)p_Var8[1]._M_color)) {
      do {
        if (1 < (int)p_Var7[1]._M_color) {
          p_Var9 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < 2];
      } while (p_Var7 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var9 != p_Var1) && ((int)p_Var9[1]._M_color < 3)) {
        (this->builder).model.sense = MAX;
        local_58 = (Expression *)CONCAT44(local_58._4_4_,2);
        pmVar5 = std::
                 map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                 ::operator[](this_00,(key_type *)&local_58);
        local_5c = OBJMAX;
        pmVar6 = std::
                 map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                 ::operator[](this_00,&local_5c);
        iVar2._M_current = (pmVar6->second)._M_current;
        local_40.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->builder).model.objective.
             super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_40.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (this->builder).model.objective.
             super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_40.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_40.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_M_use_count =
                 (local_40.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_40.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_M_use_count =
                 (local_40.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_M_use_count + 1;
          }
        }
        parseexpression(this,&pmVar5->first,iVar2,&local_40,true);
        if (local_40.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        local_58 = (Expression *)CONCAT44(local_58._4_4_,2);
        pmVar5 = std::
                 map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                 ::operator[](this_00,(key_type *)&local_58);
        local_5c = OBJMAX;
        pmVar6 = std::
                 map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                 ::operator[](this_00,&local_5c);
        if ((pmVar5->first)._M_current != (pmVar6->second)._M_current) {
          this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_02,"File not existent or illegal file format.");
          goto LAB_001ddc68;
        }
      }
    }
    else {
      (this->builder).model.sense = MIN;
      local_58 = (Expression *)CONCAT44(local_58._4_4_,1);
      pmVar5 = std::
               map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
               ::operator[](this_00,(key_type *)&local_58);
      local_5c = OBJMIN;
      pmVar6 = std::
               map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
               ::operator[](this_00,&local_5c);
      iVar2._M_current = (pmVar6->second)._M_current;
      local_30.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->builder).model.objective.
           super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_30.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->builder).model.objective.
           super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_30.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_30.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_30.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_30.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_30.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      parseexpression(this,&pmVar5->first,iVar2,&local_30,true);
      if (local_30.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_30.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      local_58 = (Expression *)CONCAT44(local_58._4_4_,1);
      pmVar5 = std::
               map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
               ::operator[](this_00,(key_type *)&local_58);
      local_5c = OBJMIN;
      pmVar6 = std::
               map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
               ::operator[](this_00,&local_5c);
      if ((pmVar5->first)._M_current != (pmVar6->second)._M_current) {
        this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_02,"File not existent or illegal file format.")
        ;
LAB_001ddc68:
        __cxa_throw(this_02,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
    }
  }
  return;
}

Assistant:

void Reader::processobjsec() {
  builder.model.objective = std::shared_ptr<Expression>(new Expression);
  if (sectiontokens.count(LpSectionKeyword::OBJMIN)) {
    builder.model.sense = ObjectiveSense::MIN;
    parseexpression(sectiontokens[LpSectionKeyword::OBJMIN].first,
                    sectiontokens[LpSectionKeyword::OBJMIN].second,
                    builder.model.objective, true);
    lpassert(sectiontokens[LpSectionKeyword::OBJMIN].first ==
             sectiontokens[LpSectionKeyword::OBJMIN]
                 .second);  // all section tokens should have been processed
  } else if (sectiontokens.count(LpSectionKeyword::OBJMAX)) {
    builder.model.sense = ObjectiveSense::MAX;
    parseexpression(sectiontokens[LpSectionKeyword::OBJMAX].first,
                    sectiontokens[LpSectionKeyword::OBJMAX].second,
                    builder.model.objective, true);
    lpassert(sectiontokens[LpSectionKeyword::OBJMAX].first ==
             sectiontokens[LpSectionKeyword::OBJMAX]
                 .second);  // all section tokens should have been processed
  }
}